

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

AVisitor<hiberlite::KillChildren> * __thiscall
hiberlite::AVisitor<hiberlite::KillChildren>::operator&
          (AVisitor<hiberlite::KillChildren> *this,
          sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *nvp)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)nvp);
  divePrefix(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  popScope(this);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(sql_nvp<X> nvp)
{
	divePrefix(nvp.name);
		walk(nvp.value);
	pop();
	return *this;
}